

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O2

ThreadCache * tcmalloc::SlowTLS::TryToReleaseCacheFromAllocation(Result *result)

{
  Entry *entry;
  ThreadCache *pTVar1;
  
  entry = result->entry_;
  if ((entry->was_allocated == true) && (ThreadCachePtr::tls_key_ != -1)) {
    pTVar1 = entry->cache;
    UnregisterEntry(entry);
  }
  else {
    pTVar1 = (ThreadCache *)0x0;
  }
  return pTVar1;
}

Assistant:

static ThreadCache* TryToReleaseCacheFromAllocation(Result* result) {
    Entry* entry = result->entry_;

    // GetSlow deals with emergency_malloc case before it calling us.
    ASSERT(!entry->emergency_malloc);

    if (PREDICT_FALSE(entry->was_allocated) && ThreadCachePtr::ThreadCacheKeyIsReady()) {
      ThreadCache* cache = entry->cache;

      SlowTLS::UnregisterEntry(entry);

      return cache;
    }

    return nullptr;
  }